

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::
ApplyVar<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::ApplyVar(ApplyVar<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
           *this,ApplyFunc *func,VariableP<tcu::Vector<float,_3>_> *arg0,
          VariableP<tcu::Vector<float,_2>_> *arg1,VariableP<vkt::shaderexecutor::Void> *arg2,
          VariableP<vkt::shaderexecutor::Void> *arg3)

{
  ExprP<vkt::shaderexecutor::Void> local_88;
  ExprP<vkt::shaderexecutor::Void> local_78 [2];
  ExprP<tcu::Vector<float,_2>_> local_58;
  ExprP<tcu::Vector<float,_3>_> local_48;
  VariableP<vkt::shaderexecutor::Void> *local_38;
  VariableP<vkt::shaderexecutor::Void> *arg3_local;
  VariableP<vkt::shaderexecutor::Void> *arg2_local;
  VariableP<tcu::Vector<float,_2>_> *arg1_local;
  VariableP<tcu::Vector<float,_3>_> *arg0_local;
  ApplyFunc *func_local;
  ApplyVar<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  local_38 = arg3;
  arg3_local = arg2;
  arg2_local = (VariableP<vkt::shaderexecutor::Void> *)arg1;
  arg1_local = (VariableP<tcu::Vector<float,_2>_> *)arg0;
  arg0_local = (VariableP<tcu::Vector<float,_3>_> *)func;
  func_local = (ApplyFunc *)this;
  shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_48);
  shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_58);
  shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)local_78);
  shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_88);
  Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::Apply(&this->
           super_Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          ,func,&local_48,&local_58,local_78,&local_88);
  ExprP<vkt::shaderexecutor::Void>::~ExprP(&local_88);
  ExprP<vkt::shaderexecutor::Void>::~ExprP(local_78);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_58);
  ExprP<tcu::Vector<float,_3>_>::~ExprP(&local_48);
  (this->
  super_Apply<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_2>,_tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ).super_Expr<tcu::Matrix<float,_3,_2>_>.super_ExprBase._vptr_ExprBase =
       (_func_int **)&PTR__ApplyVar_0167e4c8;
  return;
}

Assistant:

ApplyVar	(const ApplyFunc&			func,
									 const VariableP<Arg0>&		arg0,
									 const VariableP<Arg1>&		arg1,
									 const VariableP<Arg2>&		arg2,
									 const VariableP<Arg3>&		arg3)
							: Apply<Sig> (func, arg0, arg1, arg2, arg3) {}